

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O0

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  int extraout_EAX;
  function<void_()> local_50;
  int local_2c;
  UI_STRING *local_28;
  UI_STRING *local_20;
  update_callback *cb_local;
  fifo_path *fifo_local;
  writer *this_local;
  
  local_2c = 0;
  local_20 = uis;
  cb_local = (update_callback *)ui;
  fifo_local = (fifo_path *)this;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_28,&local_2c);
  std::function<void_()>::function(&local_50,(function<void_()> *)uis);
  writer(this,ui,local_28);
  std::function<void_()>::~function(&local_50);
  return extraout_EAX;
}

Assistant:

writer::writer (fifo_path const & fifo, update_callback cb)
                : writer (fifo, duration_type{0}, 0U, std::move (cb)) {}